

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall symbols::StringObject::~StringObject(StringObject *this)

{
  StringObject *this_local;
  
  (this->super_IteratorObject).super_Object._vptr_Object = (_func_int **)&PTR_type_001e1a40;
  std::__cxx11::string::~string((string *)&this->value);
  IteratorObject::~IteratorObject(&this->super_IteratorObject);
  return;
}

Assistant:

~StringObject(){

    }